

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

int ps_reinit(ps_decoder_t *ps,ps_config_t *config)

{
  int iVar1;
  ps_config_t *ppVar2;
  char *pcVar3;
  char *pcVar4;
  ps_arg_t *defn;
  hash_table_t *phVar5;
  logmath_t *lmath;
  acmod_t *paVar6;
  ps_search_t *val;
  dict_t *dict;
  dict2pid_t *pdVar7;
  fsg_model_t *fsg;
  ngram_model_t *base;
  ngram_model_set_iter_t *itor;
  ngram_model_t *lm;
  long lVar8;
  float64 fVar9;
  double dVar10;
  char *name;
  
  if (config == (ps_config_t *)0x0) {
    if ((ps->config != (ps_config_t *)0x0) && (iVar1 = ps_config_validate(ps->config), iVar1 < 0)) {
      return -1;
    }
  }
  else {
    iVar1 = ps_config_validate(config);
    if (iVar1 < 0) {
      return -1;
    }
    ppVar2 = ps->config;
    if (ppVar2 != config) {
      ps_config_free(ppVar2);
      ppVar2 = ps_config_retain(config);
      ps->config = ppVar2;
    }
    pcVar3 = ps_config_str(ppVar2,"logfn");
    if ((pcVar3 != (char *)0x0) && (iVar1 = err_set_logfile(pcVar3), iVar1 < 0)) {
      pcVar3 = "Cannot redirect log output\n";
      lVar8 = 0x105;
      goto LAB_0010c19d;
    }
    pcVar3 = ps_config_str(ps->config,"loglevel");
    if ((pcVar3 != (char *)0x0) && (pcVar4 = err_set_loglevel_str(pcVar3), pcVar4 == (char *)0x0)) {
      pcVar4 = "Invalid log level: %s\n";
      lVar8 = 0x10c;
      goto LAB_0010bf93;
    }
  }
  pcVar3 = ps_config_str(ps->config,"mfclogdir");
  ps->mfclogdir = pcVar3;
  pcVar3 = ps_config_str(ps->config,"rawlogdir");
  ps->rawlogdir = pcVar3;
  pcVar3 = ps_config_str(ps->config,"senlogdir");
  ps->senlogdir = pcVar3;
  ps_expand_model_config(ps->config);
  ppVar2 = ps->config;
  defn = ps_args();
  cmd_ln_log_values_r(ppVar2,defn);
  ps_free_searches(ps);
  phVar5 = hash_table_new(3,0);
  ps->searches = phVar5;
  acmod_free(ps->acmod);
  ps->acmod = (acmod_t *)0x0;
  dict_free(ps->dict);
  ps->dict = (dict_t *)0x0;
  dict2pid_free(ps->d2p);
  ps->d2p = (dict2pid_t *)0x0;
  if (ps->lmath == (logmath_t *)0x0) {
LAB_0010c096:
    dVar10 = ps_config_float(ps->config,"logbase");
    lmath = logmath_init((float64)dVar10,0,1);
    ps->lmath = lmath;
  }
  else {
    fVar9 = logmath_get_base(ps->lmath);
    dVar10 = ps_config_float(ps->config,"logbase");
    lmath = ps->lmath;
    if (((double)fVar9 != dVar10) || (NAN((double)fVar9) || NAN(dVar10))) {
      if (lmath != (logmath_t *)0x0) {
        logmath_free(lmath);
      }
      goto LAB_0010c096;
    }
  }
  paVar6 = acmod_init(ps->config,lmath,(fe_t *)0x0,(feat_t *)0x0);
  ps->acmod = paVar6;
  if (paVar6 == (acmod_t *)0x0) {
    return -1;
  }
  lVar8 = ps_config_int(ps->config,"pl_window");
  if (0 < lVar8) {
    val = phone_loop_search_init(ps->config,ps->acmod,ps->dict);
    ps->phone_loop = val;
    if (val == (ps_search_t *)0x0) {
      return -1;
    }
    hash_table_enter(ps->searches,val->name,val);
  }
  dict = dict_init(ps->config,ps->acmod->mdef);
  ps->dict = dict;
  if (dict == (dict_t *)0x0) {
    return -1;
  }
  pdVar7 = dict2pid_build(ps->acmod->mdef,dict);
  ps->d2p = pdVar7;
  if (pdVar7 == (dict2pid_t *)0x0) {
    return -1;
  }
  dVar10 = ps_config_float(ps->config,"lw");
  pcVar3 = ps_config_str(ps->config,"keyphrase");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = ps_config_str(ps->config,"kws");
    if (pcVar3 != (char *)0x0) {
      iVar1 = ps_add_kws(ps,"_default",pcVar3);
      goto joined_r0x0010c259;
    }
    pcVar3 = ps_config_str(ps->config,"fsg");
    if (pcVar3 != (char *)0x0) {
      fsg = fsg_model_readfile(pcVar3,ps->lmath,(float32)(float)(int)dVar10);
      if (fsg == (fsg_model_t *)0x0) {
        return -1;
      }
      iVar1 = ps_add_fsg(ps,"_default",fsg);
      fsg_model_free(fsg);
      goto joined_r0x0010c259;
    }
    pcVar3 = ps_config_str(ps->config,"jsgf");
    if (pcVar3 != (char *)0x0) {
      iVar1 = ps_add_jsgf_file(ps,"_default",pcVar3);
LAB_0010c2d6:
      if (iVar1 != 0) {
        return -1;
      }
      iVar1 = ps_activate_search(ps,"_default");
      if (iVar1 != 0) {
        return -1;
      }
      goto LAB_0010c1df;
    }
    pcVar3 = ps_config_str(ps->config,"allphone");
    if (pcVar3 != (char *)0x0) {
      iVar1 = ps_add_allphone_file(ps,"_default",pcVar3);
      goto LAB_0010c2d6;
    }
    pcVar3 = ps_config_str(ps->config,"lm");
    if (pcVar3 != (char *)0x0) {
      iVar1 = ps_add_lm_file(ps,"_default",pcVar3);
      goto LAB_0010c2d6;
    }
    pcVar3 = ps_config_str(ps->config,"lmctl");
    if (pcVar3 == (char *)0x0) goto LAB_0010c1df;
    base = ngram_model_set_read(ps->config,pcVar3,ps->lmath);
    if (base == (ngram_model_t *)0x0) {
      pcVar4 = "Failed to read language model control file: %s\n";
      lVar8 = 0x17c;
LAB_0010bf93:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
              ,lVar8,pcVar4,pcVar3);
      return -1;
    }
    for (itor = ngram_model_set_iter(base); itor != (ngram_model_set_iter_t *)0x0;
        itor = ngram_model_set_iter_next(itor)) {
      lm = ngram_model_set_iter_model(itor,&name);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
              ,0x183,"adding search %s\n",name);
      iVar1 = ps_add_lm(ps,name,lm);
      if (iVar1 != 0) {
        ngram_model_set_iter_free(itor);
        ngram_model_free(base);
        return -1;
      }
    }
    ngram_model_free(base);
    pcVar3 = ps_config_str(ps->config,"lmname");
    name = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "No default LM name (-lmname) for `-lmctl\'\n";
      lVar8 = 400;
      name = (char *)0x0;
LAB_0010c19d:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
              ,lVar8,pcVar3);
      return -1;
    }
  }
  else {
    iVar1 = ps_add_keyphrase(ps,"_default",pcVar3);
joined_r0x0010c259:
    if (iVar1 != 0) {
      return -1;
    }
    pcVar3 = "_default";
  }
  ps_activate_search(ps,pcVar3);
LAB_0010c1df:
  (ps->perf).name = "decode";
  ptmr_init(&ps->perf);
  return 0;
}

Assistant:

int
ps_reinit(ps_decoder_t *ps, ps_config_t *config)
{
    const char *path;
    const char *keyphrase;
    int32 lw;

    /* Enforce only one of keyphrase, kws, fsg, jsgf, allphone, lm */
    if (config) {
        if (ps_config_validate(config) < 0)
            return -1;
    }
    else if (ps->config) {
        if (ps_config_validate(ps->config) < 0)
            return -1;
    }

    if (config && config != ps->config) {
        ps_config_free(ps->config);
        ps->config = ps_config_retain(config);
    }

    /* Set up logging. We need to do this earlier because we want to dump
     * the information to the configured log, not to the stderr. */
    if (config) {
        const char *logfn, *loglevel;
        logfn = ps_config_str(ps->config, "logfn");
        if (logfn) {
            if (err_set_logfile(logfn) < 0) {
                E_ERROR("Cannot redirect log output\n");
                return -1;
            }
        }
        loglevel = ps_config_str(ps->config, "loglevel");
        if (loglevel) {
            if (err_set_loglevel_str(loglevel) == NULL) {
                E_ERROR("Invalid log level: %s\n", loglevel);
                return -1;
            }
        }
    }
    
    ps->mfclogdir = ps_config_str(ps->config, "mfclogdir");
    ps->rawlogdir = ps_config_str(ps->config, "rawlogdir");
    ps->senlogdir = ps_config_str(ps->config, "senlogdir");

    /* Fill in some default arguments. */
    ps_expand_model_config(ps->config);

    /* Print out the config for logging. */
    cmd_ln_log_values_r(ps->config, ps_args());
    
    /* Free old searches (do this before other reinit) */
    ps_free_searches(ps);
    ps->searches = hash_table_new(3, HASH_CASE_YES);

    /* Free old acmod. */
    acmod_free(ps->acmod);
    ps->acmod = NULL;

    /* Free old dictionary (must be done after the two things above) */
    dict_free(ps->dict);
    ps->dict = NULL;

    /* Free d2p */
    dict2pid_free(ps->d2p);
    ps->d2p = NULL;

    /* Logmath computation (used in acmod and search) */
    if (ps->lmath == NULL
        || (logmath_get_base(ps->lmath) !=
            ps_config_float(ps->config, "logbase"))) {
        if (ps->lmath)
            logmath_free(ps->lmath);
        ps->lmath = logmath_init
            (ps_config_float(ps->config, "logbase"), 0, TRUE);
    }

    /* Acoustic model (this is basically everything that
     * uttproc.c, senscr.c, and others used to do) */
    if ((ps->acmod = acmod_init(ps->config, ps->lmath, NULL, NULL)) == NULL)
        return -1;

    if (ps_config_int(ps->config, "pl_window") > 0) {
        /* Initialize an auxiliary phone loop search, which will run in
         * "parallel" with FSG or N-Gram search. */
        if ((ps->phone_loop =
             phone_loop_search_init(ps->config, ps->acmod, ps->dict)) == NULL)
            return -1;
        hash_table_enter(ps->searches,
                         ps_search_name(ps->phone_loop),
                         ps->phone_loop);
    }

    /* Dictionary and triphone mappings (depends on acmod). */
    /* FIXME: pass config, change arguments, implement LTS, etc. */
    if ((ps->dict = dict_init(ps->config, ps->acmod->mdef)) == NULL)
        return -1;
    if ((ps->d2p = dict2pid_build(ps->acmod->mdef, ps->dict)) == NULL)
        return -1;

    lw = ps_config_float(ps->config, "lw");

    /* Determine whether we are starting out in FSG or N-Gram search mode.
     * If neither is used skip search initialization. */

    if ((keyphrase = ps_config_str(ps->config, "keyphrase"))) {
        if (ps_add_keyphrase(ps, PS_DEFAULT_SEARCH, keyphrase))
            return -1;
        ps_activate_search(ps, PS_DEFAULT_SEARCH);
    }
    else if ((path = ps_config_str(ps->config, "kws"))) {
        if (ps_add_kws(ps, PS_DEFAULT_SEARCH, path))
            return -1;
        ps_activate_search(ps, PS_DEFAULT_SEARCH);
    }
    else if ((path = ps_config_str(ps->config, "fsg"))) {
        fsg_model_t *fsg = fsg_model_readfile(path, ps->lmath, lw);
        if (!fsg)
            return -1;
        if (ps_add_fsg(ps, PS_DEFAULT_SEARCH, fsg)) {
            fsg_model_free(fsg);
            return -1;
        }
        fsg_model_free(fsg);
        ps_activate_search(ps, PS_DEFAULT_SEARCH);
    }
    else if ((path = ps_config_str(ps->config, "jsgf"))) {
        if (ps_add_jsgf_file(ps, PS_DEFAULT_SEARCH, path)
            || ps_activate_search(ps, PS_DEFAULT_SEARCH))
            return -1;
    }
    else if ((path = ps_config_str(ps->config, "allphone"))) {
        if (ps_add_allphone_file(ps, PS_DEFAULT_SEARCH, path)
            || ps_activate_search(ps, PS_DEFAULT_SEARCH))
            return -1;
    }
    else if ((path = ps_config_str(ps->config, "lm"))) {
        if (ps_add_lm_file(ps, PS_DEFAULT_SEARCH, path)
            || ps_activate_search(ps, PS_DEFAULT_SEARCH))
            return -1;
    }
    else if ((path = ps_config_str(ps->config, "lmctl"))) {
        const char *name;
        ngram_model_t *lmset;
        ngram_model_set_iter_t *lmset_it;

        if (!(lmset = ngram_model_set_read(ps->config, path, ps->lmath))) {
            E_ERROR("Failed to read language model control file: %s\n", path);
            return -1;
        }

        for(lmset_it = ngram_model_set_iter(lmset);
            lmset_it; lmset_it = ngram_model_set_iter_next(lmset_it)) {    
            ngram_model_t *lm = ngram_model_set_iter_model(lmset_it, &name);            
            E_INFO("adding search %s\n", name);
            if (ps_add_lm(ps, name, lm)) {
                ngram_model_set_iter_free(lmset_it);
        	ngram_model_free(lmset);
                return -1;
            }
        }
        ngram_model_free(lmset);

        name = ps_config_str(ps->config, "lmname");
        if (name)
            ps_activate_search(ps, name);
        else {
            E_ERROR("No default LM name (-lmname) for `-lmctl'\n");
            return -1;
        }
    }

    /* Initialize performance timer. */
    ps->perf.name = "decode";
    ptmr_init(&ps->perf);

    return 0;
}